

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_q.c
# Opt level: O2

float64 best_q(float32 ****mixw,float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,
              uint32 n_state,uint32 n_stream,uint32 n_density,float32 *stwt,uint32 **dfeat,
              uint32 n_dfeat,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 *id,uint32 n_id,
              float32 ***dist,float64 node_wt_ent,quest_t **out_best_q)

{
  uint uVar1;
  float *pfVar2;
  float32 *pfVar3;
  float64 fVar4;
  float64 fVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  cmd_ln_t *pcVar11;
  char *__s1;
  undefined8 *inptr;
  undefined8 *inptr_00;
  long lVar12;
  size_t __n;
  ulong uVar13;
  quest_t *q;
  void *ptr;
  void *ptr_00;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong d2;
  ulong d1;
  size_t __n_00;
  ulong d3;
  float fVar20;
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  uint local_110;
  uint local_10c;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined8 *local_f0;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  float local_d4;
  double local_c8;
  double dStack_b0;
  
  pcVar11 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar11,"-ts2cbfn");
  iVar9 = strcmp(__s1,".semi.");
  if ((iVar9 != 0) && (iVar9 = strcmp(__s1,".cont."), iVar9 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
            ,0x67,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
    exit(1);
  }
  iVar9 = strcmp(__s1,".cont.");
  d2 = (ulong)n_stream;
  d1 = (ulong)n_state;
  if (iVar9 == 0) {
    pcVar11 = cmd_ln_get();
    dVar8 = cmd_ln_float_r(pcVar11,"-varfloor");
    uVar17 = 0;
    for (uVar16 = 0; d2 != uVar16; uVar16 = uVar16 + 1) {
      uVar17 = uVar17 + veclen[uVar16];
    }
    local_d4 = (float)dVar8;
    uVar16 = (ulong)uVar17;
    local_f0 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,uVar16,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x71);
    local_f8 = (undefined8 *)
               __ckd_calloc_3d__(d1,d2,uVar16,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                 ,0x72);
    local_100 = (undefined8 *)
                __ckd_calloc_3d__(d1,d2,uVar16,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                  ,0x73);
    local_108 = (undefined8 *)
                __ckd_calloc_3d__(d1,d2,uVar16,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                  ,0x74);
  }
  else {
    local_d4 = 0.0;
    local_100 = (undefined8 *)0x0;
    local_108 = (undefined8 *)0x0;
    local_f8 = (undefined8 *)0x0;
    local_f0 = (undefined8 *)0x0;
    uVar16 = 0;
  }
  d3 = (ulong)n_density;
  inptr = (undefined8 *)
          __ckd_calloc_3d__(d1,d2,d3,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                            ,0x79);
  inptr_00 = (undefined8 *)
             __ckd_calloc_3d__(d1,d2,d3,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                               ,0x7a);
  lVar12 = d1 * d2 * 4;
  __n_00 = uVar16 * lVar12;
  __n = lVar12 * d3;
  local_c8 = -1e+50;
  uVar16 = 0;
  local_d8 = 0;
  local_dc = 0;
  local_e0 = 0;
  do {
    if (uVar16 == n_all_q) {
      q = (quest_t *)0x0;
      uVar22 = 0;
      uVar23 = 0;
      if ((local_d8 != 0) && (local_dc != 0)) {
        ptr = __ckd_calloc__((ulong)local_d8,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                             ,0x112);
        ptr_00 = __ckd_calloc__((ulong)local_dc,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/best_q.c"
                                ,0x113);
        memset(*(void **)*inptr,0,__n);
        memset(*(void **)*inptr_00,0,__n);
        q = all_q + local_e0;
        uVar17 = 0;
        uVar18 = 0;
        for (uVar16 = 0; uVar16 != n_id; uVar16 = uVar16 + 1) {
          uVar1 = id[uVar16];
          iVar10 = eval_quest(q,dfeat[uVar1],n_dfeat);
          if (iVar10 == 0) {
            for (uVar15 = 0; uVar15 != d1; uVar15 = uVar15 + 1) {
              for (uVar13 = 0; uVar13 != d2; uVar13 = uVar13 + 1) {
                for (uVar14 = 0; d3 != uVar14; uVar14 = uVar14 + 1) {
                  lVar12 = *(long *)(inptr_00[uVar15] + uVar13 * 8);
                  *(float *)(lVar12 + uVar14 * 4) =
                       (float)mixw[uVar1][uVar15][uVar13][uVar14] + *(float *)(lVar12 + uVar14 * 4);
                }
              }
            }
            *(uint *)((long)ptr_00 + (ulong)uVar18 * 4) = uVar1;
            uVar18 = uVar18 + 1;
          }
          else {
            for (uVar15 = 0; uVar15 != d1; uVar15 = uVar15 + 1) {
              for (uVar13 = 0; uVar13 != d2; uVar13 = uVar13 + 1) {
                for (uVar14 = 0; d3 != uVar14; uVar14 = uVar14 + 1) {
                  lVar12 = *(long *)(inptr[uVar15] + uVar13 * 8);
                  *(float *)(lVar12 + uVar14 * 4) =
                       (float)mixw[uVar1][uVar15][uVar13][uVar14] + *(float *)(lVar12 + uVar14 * 4);
                }
              }
            }
            *(uint *)((long)ptr + (ulong)uVar17 * 4) = uVar1;
            uVar17 = uVar17 + 1;
          }
        }
        ckd_free_3d(inptr);
        ckd_free(ptr);
        ckd_free_3d(inptr_00);
        ckd_free(ptr_00);
        if (iVar9 == 0) {
          ckd_free_3d(local_f0);
          ckd_free_3d(local_f8);
          ckd_free_3d(local_100);
          ckd_free_3d(local_108);
        }
        uVar22 = SUB84(local_c8,0);
        uVar23 = (undefined4)((ulong)local_c8 >> 0x20);
      }
      *out_best_q = q;
      return (float64)CONCAT44(uVar23,uVar22);
    }
    memset(*(void **)*inptr,0,__n);
    memset(*(void **)*inptr_00,0,__n);
    if (iVar9 == 0) {
      memset(*(void **)*local_f0,0,__n_00);
      memset(*(void **)*local_f8,0,__n_00);
      memset(*(void **)*local_100,0,__n_00);
      memset(*(void **)*local_108,0,__n_00);
    }
    local_10c = 0;
    local_110 = 0;
    for (uVar15 = 0; uVar15 != n_id; uVar15 = uVar15 + 1) {
      uVar17 = id[uVar15];
      iVar10 = eval_quest(all_q + uVar16,dfeat[uVar17],n_dfeat);
      if (iVar10 == 0) {
        for (uVar13 = 0; uVar13 != d1; uVar13 = uVar13 + 1) {
          for (uVar14 = 0; uVar14 != d2; uVar14 = uVar14 + 1) {
            for (uVar19 = 0; d3 != uVar19; uVar19 = uVar19 + 1) {
              lVar12 = *(long *)(inptr_00[uVar13] + uVar14 * 8);
              *(float *)(lVar12 + uVar19 * 4) =
                   (float)mixw[uVar17][uVar13][uVar14][uVar19] + *(float *)(lVar12 + uVar19 * 4);
            }
          }
        }
        if (iVar9 == 0) {
          for (uVar13 = 0; uVar13 != d1; uVar13 = uVar13 + 1) {
            for (uVar14 = 0; uVar14 != d2; uVar14 = uVar14 + 1) {
              uVar18 = veclen[uVar14];
              for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                pfVar2 = (float *)mixw[uVar17][uVar13][uVar14];
                pfVar3 = means[uVar17][uVar13][uVar14];
                lVar12 = *(long *)(local_100[uVar13] + uVar14 * 8);
                *(float *)(lVar12 + uVar19 * 4) =
                     *pfVar2 * (float)pfVar3[uVar19] + *(float *)(lVar12 + uVar19 * 4);
                fVar20 = (float)pfVar3[uVar19];
                lVar12 = *(long *)(local_108[uVar13] + uVar14 * 8);
                *(float *)(lVar12 + uVar19 * 4) =
                     (fVar20 * fVar20 + (float)vars[uVar17][uVar13][uVar14][uVar19]) * *pfVar2 +
                     *(float *)(lVar12 + uVar19 * 4);
              }
            }
          }
        }
        local_110 = local_110 + 1;
      }
      else {
        for (uVar13 = 0; uVar13 != d1; uVar13 = uVar13 + 1) {
          for (uVar14 = 0; uVar14 != d2; uVar14 = uVar14 + 1) {
            for (uVar19 = 0; d3 != uVar19; uVar19 = uVar19 + 1) {
              lVar12 = *(long *)(inptr[uVar13] + uVar14 * 8);
              *(float *)(lVar12 + uVar19 * 4) =
                   (float)mixw[uVar17][uVar13][uVar14][uVar19] + *(float *)(lVar12 + uVar19 * 4);
            }
          }
        }
        if (iVar9 == 0) {
          for (uVar13 = 0; uVar13 != d1; uVar13 = uVar13 + 1) {
            for (uVar14 = 0; uVar14 != d2; uVar14 = uVar14 + 1) {
              uVar18 = veclen[uVar14];
              for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                pfVar2 = (float *)mixw[uVar17][uVar13][uVar14];
                pfVar3 = means[uVar17][uVar13][uVar14];
                lVar12 = *(long *)(local_f0[uVar13] + uVar14 * 8);
                *(float *)(lVar12 + uVar19 * 4) =
                     *pfVar2 * (float)pfVar3[uVar19] + *(float *)(lVar12 + uVar19 * 4);
                fVar20 = (float)pfVar3[uVar19];
                lVar12 = *(long *)(local_f8[uVar13] + uVar14 * 8);
                *(float *)(lVar12 + uVar19 * 4) =
                     (fVar20 * fVar20 + (float)vars[uVar17][uVar13][uVar14][uVar19]) * *pfVar2 +
                     *(float *)(lVar12 + uVar19 * 4);
              }
            }
          }
        }
        local_10c = local_10c + 1;
      }
    }
    if (local_110 != 0 && local_10c != 0) {
      dVar8 = 0.0;
      for (uVar15 = 0; uVar15 != d1; uVar15 = uVar15 + 1) {
        dVar25 = 0.0;
        for (uVar13 = 0; d3 != uVar13; uVar13 = uVar13 + 1) {
          dVar25 = dVar25 + (double)*(float *)(*(long *)inptr[uVar15] + uVar13 * 4);
        }
        if ((dVar25 == 0.0) && (!NAN(dVar25))) break;
        dVar26 = 1.0 / dVar25;
        for (uVar13 = 0; uVar13 != d2; uVar13 = uVar13 + 1) {
          for (uVar14 = 0; d3 != uVar14; uVar14 = uVar14 + 1) {
            lVar12 = *(long *)(inptr[uVar15] + uVar13 * 8);
            *(float *)(lVar12 + uVar14 * 4) =
                 (float)((double)*(float *)(lVar12 + uVar14 * 4) * dVar26);
          }
        }
        dVar24 = 0.0;
        for (uVar13 = 0; d3 != uVar13; uVar13 = uVar13 + 1) {
          dVar24 = dVar24 + (double)*(float *)(*(long *)inptr_00[uVar15] + uVar13 * 4);
        }
        if ((dVar24 == 0.0) && (!NAN(dVar24))) break;
        dVar27 = 1.0 / dVar24;
        for (uVar13 = 0; uVar13 != d2; uVar13 = uVar13 + 1) {
          for (uVar14 = 0; d3 != uVar14; uVar14 = uVar14 + 1) {
            lVar12 = *(long *)(inptr_00[uVar15] + uVar13 * 8);
            *(float *)(lVar12 + uVar14 * 4) =
                 (float)((double)*(float *)(lVar12 + uVar14 * 4) * dVar27);
          }
        }
        if (iVar9 == 0) {
          dVar7 = 0.0;
          dStack_b0 = 0.0;
          uVar13 = 0;
          while( true ) {
            if (uVar13 == d2) break;
            auVar6._8_4_ = SUB84(dStack_b0,0);
            auVar6._0_8_ = dVar7;
            auVar6._12_4_ = (int)((ulong)dStack_b0 >> 0x20);
            uVar17 = veclen[uVar13];
            for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
              lVar12 = *(long *)(local_f0[uVar15] + uVar13 * 8);
              fVar20 = (float)((double)*(float *)(lVar12 + uVar14 * 4) * dVar26);
              *(float *)(lVar12 + uVar14 * 4) = fVar20;
              lVar12 = *(long *)(local_f8[uVar15] + uVar13 * 8);
              fVar21 = (float)((double)*(float *)(lVar12 + uVar14 * 4) * dVar26 -
                              (double)(fVar20 * fVar20));
              fVar20 = local_d4;
              if (local_d4 <= fVar21) {
                fVar20 = fVar21;
              }
              *(float *)(lVar12 + uVar14 * 4) = fVar20;
            }
            for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
              lVar12 = *(long *)(local_100[uVar15] + uVar13 * 8);
              fVar20 = (float)((double)*(float *)(lVar12 + uVar14 * 4) * dVar27);
              *(float *)(lVar12 + uVar14 * 4) = fVar20;
              lVar12 = *(long *)(local_108[uVar15] + uVar13 * 8);
              fVar21 = (float)((double)*(float *)(lVar12 + uVar14 * 4) * dVar27 -
                              (double)(fVar20 * fVar20));
              fVar20 = local_d4;
              if (local_d4 <= fVar21) {
                fVar20 = fVar21;
              }
              *(float *)(lVar12 + uVar14 * 4) = fVar20;
            }
            fVar4 = ent_cont(*(float32 **)(local_f0[uVar15] + uVar13 * 8),
                             *(float32 **)(local_f8[uVar15] + uVar13 * 8),uVar17);
            fVar5 = ent_cont(*(float32 **)(local_100[uVar15] + uVar13 * 8),
                             *(float32 **)(local_108[uVar15] + uVar13 * 8),veclen[uVar13]);
            dStack_b0 = auVar6._8_8_;
            dVar7 = dVar7 + (double)fVar4 * dVar25;
            dStack_b0 = dStack_b0 + (double)fVar5 * dVar24;
            uVar13 = uVar13 + 1;
          }
          dVar25 = (dStack_b0 + dVar7) * (double)(float)stwt[uVar15];
        }
        else {
          fVar20 = (float)stwt[uVar15];
          fVar4 = wt_ent_inc((float32 **)inptr[uVar15],(float32)(float)dVar25,
                             (float32 **)inptr_00[uVar15],(float32)(float)dVar24,dist[uVar15],
                             n_stream,n_density);
          dVar25 = (double)fVar4 * (double)fVar20;
        }
        dVar8 = dVar8 + dVar25;
      }
      if (iVar9 == 0) {
        dVar8 = dVar8 - (double)node_wt_ent;
      }
      if ((d1 <= uVar15) && (local_c8 < dVar8)) {
        local_d8 = local_10c;
        local_dc = local_110;
        local_e0 = (uint)uVar16;
        local_c8 = dVar8;
      }
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

float64
best_q(float32 ****mixw,
       float32 ****means,
       float32 ****vars,
       uint32  *veclen,
       uint32 n_model,
       uint32 n_state,
       uint32 n_stream,
       uint32 n_density,
       float32 *stwt,
       uint32 **dfeat,
       uint32 n_dfeat,
       quest_t *all_q,
       uint32 n_all_q,
       pset_t *pset,
       uint32 *id,
       uint32 n_id,
       float32 ***dist,
       float64 node_wt_ent,  /* Weighted entropy of node */
       quest_t **out_best_q)
{
    float32 ***yes_dist;
    float32 ***yes_means=0;
    float32 ***yes_vars=0;
    float32 varfloor=0;
    float64 y_ent;
    float64 yes_dnom, yes_norm;
    uint32 *yes_id;
    float32 ***no_dist;
    float32 ***no_means=0;
    float32 ***no_vars=0;
    float64 n_ent;
    float64 no_dnom, no_norm;
    uint32 *no_id;
    uint32 n_yes, n_b_yes = 0;
    uint32 n_no, n_b_no = 0;
    uint32 i, j, k, q, b_q=0, s;
    uint32 ii;
    float64 einc, b_einc = -1.0e+50;

    const char*  type;
    uint32 continuous, sumveclen=0;

    type = cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0)
        continuous = 1;
    else
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Allocating for sumveclen is overallocation, but it eases coding */
        for (ii=0,sumveclen=0;ii<n_stream;ii++) sumveclen += veclen[ii];
        yes_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        yes_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_means = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        no_vars = (float32 ***)ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    n_yes = n_no = 0;

    yes_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    no_dist = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));

    for (q = 0; q < n_all_q; q++) {
	memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
	memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);

        if (continuous == 1) {
	    memset(&yes_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&yes_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_means[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
	    memset(&no_vars[0][0][0], 0, sizeof(float32) * n_state * n_stream * sumveclen);
        }

	n_yes = n_no = 0;

	for (ii = 0; ii < n_id; ii++) {
	    i = id[ii];
	    if (eval_quest(&all_q[q], dfeat[i], n_dfeat)) {
	        for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    yes_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                yes_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                yes_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_yes;
	    }
	    else {
		for (s = 0; s < n_state; s++) {
		    for (j = 0; j < n_stream; j++) {
			for (k = 0; k < n_density; k++) {
			    no_dist[s][j][k] += mixw[i][s][j][k];
			}
		    }
		}
                if (continuous == 1) {
	            for (s = 0; s < n_state; s++) {
		        for (j = 0; j < n_stream; j++) {
			    for (k = 0; k < veclen[j]; k++) {
                                no_means[s][j][k] += mixw[i][s][j][0] * means[i][s][j][k];
                                no_vars[s][j][k] += mixw[i][s][j][0] * (vars[i][s][j][k] + means[i][s][j][k]*means[i][s][j][k]);
			    }
		        }
		    }
		}
		++n_no;
	    }
	}
	
	if ((n_yes == 0) || (n_no == 0)) {
	    /* no split.  All satisfy or all don't satisfy */
	    continue;
	}


	for (s = 0, einc = 0; s < n_state; s++) {
	    for (k = 0, yes_dnom = 0; k < n_density; k++) {
		yes_dnom += yes_dist[s][0][k];
	    }
	
	    if (yes_dnom == 0)
	      break;

	    yes_norm = 1.0 / yes_dnom;
	
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    yes_dist[s][j][k] *= yes_norm;
		}
	    }
	
	    for (k = 0, no_dnom = 0; k < n_density; k++) {
		no_dnom += no_dist[s][0][k];
	    }
	
	    if (no_dnom == 0)
	      break;

	    no_norm = 1.0 / no_dnom;
	    
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < n_density; k++) {
		    no_dist[s][j][k] *= no_norm;
		}
	    }

            if (continuous == 1) {
                y_ent = 0;
                n_ent = 0;
	        for (j = 0; j < n_stream; j++) {
                    if (yes_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            yes_means[s][j][k] *= yes_norm;
                            yes_vars[s][j][k] = yes_vars[s][j][k]*yes_norm - 
                                          yes_means[s][j][k]*yes_means[s][j][k];
                            if (yes_vars[s][j][k] < varfloor) yes_vars[s][j][k] = varfloor;
                        }
                    }
                    if (no_dnom != 0) {
   		        for (k = 0; k < veclen[j]; k++) {
                            no_means[s][j][k] *= no_norm;
                            no_vars[s][j][k] = no_vars[s][j][k]*no_norm - 
                                            no_means[s][j][k]*no_means[s][j][k];
                            if (no_vars[s][j][k] < varfloor) no_vars[s][j][k] = varfloor;
                        }
                    }
                    y_ent +=  yes_dnom * ent_cont(yes_means[s][j],yes_vars[s][j],veclen[j]);
                    n_ent +=  no_dnom * ent_cont(no_means[s][j],no_vars[s][j],veclen[j]);
                }
                einc += (float64)stwt[s] * (y_ent + n_ent);
            }
            else {
	        einc += (float64)stwt[s] * wt_ent_inc(yes_dist[s], yes_dnom,
	    				     no_dist[s], no_dnom,
					     dist[s], n_stream, n_density);
            }
	}

        if (continuous == 1) {
            einc -=  node_wt_ent;
        }

	if (s < n_state) {
	  /* Ended iteration over states prematurely; assume 'bad' question */
	  continue;
	}
	
	if (einc > b_einc) {
	    b_einc = einc;
	    b_q = q;
	    n_b_yes = n_yes;
	    n_b_no = n_no;
	}
    }

    if ((n_b_yes == 0) || (n_b_no == 0)) {
	/* No best question */
	*out_best_q = NULL;

	return 0;
    }

    yes_id = (uint32 *)ckd_calloc(n_b_yes, sizeof(uint32));
    no_id  = (uint32 *)ckd_calloc(n_b_no, sizeof(uint32));

    memset(&yes_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    memset(&no_dist[0][0][0], 0, sizeof(float32) * n_state * n_stream * n_density);
    n_yes = n_no = 0;

    for (ii = 0; ii < n_id; ii++) {
	i = id[ii];
	if (eval_quest(&all_q[b_q], dfeat[i], n_dfeat)) {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			yes_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    yes_id[n_yes] = i;
	    ++n_yes;
	}
	else {
	    for (s = 0; s < n_state; s++) {
		for (j = 0; j < n_stream; j++) {
		    for (k = 0; k < n_density; k++) {
			no_dist[s][j][k] += mixw[i][s][j][k];
		    }
		}
	    }
	    no_id[n_no] = i;
	    ++n_no;
	}
    }
    
    ckd_free_3d((void ***)yes_dist);
    ckd_free((void *)yes_id);
    ckd_free_3d((void ***)no_dist);
    ckd_free((void *)no_id);

    if (continuous == 1) {
        ckd_free_3d((void ***)yes_means);
        ckd_free_3d((void ***)yes_vars);
        ckd_free_3d((void ***)no_means);
        ckd_free_3d((void ***)no_vars);
    }

    *out_best_q = &all_q[b_q];

    return b_einc;
}